

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int maxtostore(FuncState *fs)

{
  int iVar1;
  int numfreeregs;
  FuncState *fs_local;
  
  iVar1 = 0xff - (uint)fs->freereg;
  if (iVar1 < 0xa0) {
    if (iVar1 < 0x50) {
      fs_local._4_4_ = 1;
    }
    else {
      fs_local._4_4_ = 10;
    }
  }
  else {
    fs_local._4_4_ = iVar1 / 5;
  }
  return fs_local._4_4_;
}

Assistant:

static int maxtostore (FuncState *fs) {
  int numfreeregs = MAX_FSTACK - fs->freereg;
  if (numfreeregs >= 160)  /* "lots" of registers? */
    return numfreeregs / 5;  /* use up to 1/5 of them */
  else if (numfreeregs >= 80)  /* still "enough" registers? */
    return 10;  /* one 'SETLIST' instruction for each 10 values */
  else  /* save registers for potential more nesting */
    return 1;
}